

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::resizeSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  uint uVar1;
  BinaryCollection *binaryRegistry;
  uint auVar2 [2];
  TestStatus *pTVar3;
  VkInstance device;
  VkResult VVar4;
  uint (*pauVar5) [2];
  TestError *this;
  long lVar6;
  ulong numFences;
  uint uVar7;
  uint uVar8;
  size_t numCommandBuffers;
  ulong uVar9;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  UVec2 desiredSize;
  VkPipelineStageFlags waitDstStage;
  VkSemaphore imageReadySemaphore;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  Move<vk::Handle<(vk::HandleType)26>_> swapchain;
  NativeObjects native;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Move<vk::Handle<(vk::HandleType)26>_> prevSwapchain;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  VkPresentInfoKHR presentInfo;
  VkSurfaceCapabilitiesKHR capabilities;
  Vector<unsigned_int,_2> res;
  VkSwapchainCreateInfoKHR swapchainInfo;
  DeviceHelper devHelper;
  InstanceHelper instHelper;
  TriangleRenderer renderer;
  SimpleAllocator allocator;
  uint *puVar10;
  uint local_e4c;
  Context *local_e48;
  deUint64 local_e40;
  uint local_e38 [2];
  Type local_e30;
  undefined4 local_e2c;
  undefined1 local_e28 [16];
  PFN_vkReallocationFunction local_e18;
  PFN_vkFreeFunction local_e10;
  Move<vk::Handle<(vk::HandleType)26>_> local_e08;
  NativeObjects local_de8;
  VkSurfaceKHR local_dc8;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_dc0;
  VkDevice local_db8;
  VkAllocationCallbacks *pVStack_db0;
  VkSwapchainKHR local_da8;
  Deleter<vk::Handle<(vk::HandleType)26>_> DStack_da0;
  TestStatus *local_d80;
  long local_d78;
  VkCommandBuffer local_d70;
  deUint64 local_d68;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  local_d60;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d48;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d30;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_d18;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_d00;
  VkExtent2D local_ce8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_ce0;
  Enum<vk::VkResult,_4UL> local_cc0;
  undefined4 local_cb0;
  deUint64 *local_ca8;
  undefined4 local_ca0;
  Move<vk::Handle<(vk::HandleType)26>_> *local_c98;
  uint *local_c90;
  undefined8 local_c88;
  VkSurfaceCapabilitiesKHR local_c7c;
  undefined1 local_c48 [8];
  DeviceInterface *pDStack_c40;
  VkDevice local_c38;
  VkAllocationCallbacks *pVStack_c30;
  undefined4 *local_c28;
  deUint32 local_c20;
  VkCommandBuffer *local_c18;
  deUint32 local_c10;
  deUint64 *local_c08;
  ios_base local_bd0 [400];
  VkSwapchainCreateInfoKHR local_a40;
  undefined1 local_9d8 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_9d0;
  VkInstance local_9c8;
  VkAllocationCallbacks *pVStack_9c0;
  VkAllocationCallbacks *local_9b8;
  DeviceDriver local_9b0;
  VkQueue local_4f8;
  InstanceHelper local_4f0;
  TriangleRenderer local_338;
  SimpleAllocator local_250;
  
  local_e38[0] = 0x100;
  local_e38[1] = 0x100;
  InstanceHelper::InstanceHelper(&local_4f0,context,wsiType,(VkAllocationCallbacks *)0x0);
  auVar2 = local_e38;
  local_9d8 = (undefined1  [8])&aStack_9d0;
  aStack_9d0.m_align._0_4_ = local_e38[0];
  aStack_9d0.m_align._4_4_ = local_e38[1];
  local_e48 = context;
  NativeObjects::NativeObjects
            (&local_de8,context,&local_4f0.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_9d8);
  vki = &local_4f0.vki;
  puVar10 = (uint *)0x0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_9d8,&vki->super_InstanceInterface,
             local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_de8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_de8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_db8 = (VkDevice)local_9c8;
  pVStack_db0 = pVStack_9c0;
  local_dc8.m_internal = (deUint64)local_9d8;
  aStack_dc0 = aStack_9d0;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_9d8,local_e48,&vki->super_InstanceInterface,
             local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_9d8,(VkAllocationCallbacks *)0x0);
  ::vk::wsi::getPlatformProperties(wsiType);
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            (&local_c7c,&vki->super_InstanceInterface,(VkPhysicalDevice)local_9d8,local_dc8);
  device = local_9c8;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_c48,&vki->super_InstanceInterface,
             (VkPhysicalDevice)local_9d8);
  ::vk::SimpleAllocator::SimpleAllocator
            (&local_250,&local_9b0.super_DeviceInterface,(VkDevice)device,
             (VkPhysicalDeviceMemoryProperties *)local_c48);
  pauVar5 = (uint (*) [2])operator_new(0x18);
  *pauVar5 = (uint  [2])0x0;
  pauVar5[1] = (uint  [2])0x0;
  lVar6 = 0;
  pauVar5[2] = (uint  [2])0x0;
  local_c48._0_4_ = 0;
  local_c48._4_4_ = 0;
  do {
    *(uint *)(local_c48 + lVar6 * 4) = local_e38[lVar6] >> 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  *pauVar5 = (uint  [2])local_c48;
  pauVar5[1] = auVar2;
  local_c48._0_4_ = 0;
  local_c48._4_4_ = 0;
  lVar6 = 0;
  do {
    *(uint *)(local_c48 + lVar6 * 4) = local_e38[lVar6] * 2;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  pauVar5[2] = (uint  [2])local_c48;
  lVar6 = 0;
  do {
    uVar7 = pauVar5[lVar6][0];
    uVar8 = local_c7c.maxImageExtent.width;
    if (uVar7 < local_c7c.maxImageExtent.width) {
      uVar8 = uVar7;
    }
    uVar1 = pauVar5[lVar6][1];
    if (uVar7 < local_c7c.minImageExtent.width) {
      uVar8 = local_c7c.minImageExtent.width;
    }
    uVar7 = local_c7c.maxImageExtent.height;
    if (uVar1 < local_c7c.maxImageExtent.height) {
      uVar7 = uVar1;
    }
    if (uVar1 < local_c7c.minImageExtent.height) {
      uVar7 = local_c7c.minImageExtent.height;
    }
    pauVar5[lVar6][0] = uVar8;
    pauVar5[lVar6][1] = uVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  DStack_da0.m_device = (VkDevice)0x0;
  DStack_da0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_da8.m_internal._0_4_ = 0;
  local_da8.m_internal._4_4_ = 0;
  DStack_da0.m_deviceIface = (DeviceInterface *)0x0;
  lVar6 = 0;
  local_e30 = wsiType;
  local_d80 = __return_storage_ptr__;
  do {
    getBasicSwapchainParameters
              (&local_a40,local_e30,&local_4f0.vki.super_InstanceInterface,
               (VkPhysicalDevice)local_9d8,local_dc8,(UVec2 *)(pauVar5 + lVar6),(deUint32)puVar10);
    local_a40.oldSwapchain.m_internal = local_da8.m_internal;
    ::vk::createSwapchainKHR
              (&local_e08,&local_9b0.super_DeviceInterface,(VkDevice)device,&local_a40,
               (VkAllocationCallbacks *)0x0);
    local_d78 = lVar6;
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)(local_e28 + 8),&local_9b0.super_DeviceInterface,(VkDevice)device,
               (VkSwapchainKHR)
               local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal);
    binaryRegistry = local_e48->m_progCollection;
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(&local_d00,
           (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
           )(local_e28 + 8));
    local_c48._0_4_ = local_a40.imageExtent.width;
    local_c48._4_4_ = local_a40.imageExtent.height;
    TriangleRenderer::TriangleRenderer
              (&local_338,&local_9b0.super_DeviceInterface,(VkDevice)device,
               &local_250.super_Allocator,binaryRegistry,&local_d00,local_a40.imageFormat,
               (UVec2 *)local_c48);
    if (local_d00.
        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d00.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d00.
                            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d00.
                            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    numCommandBuffers = 0;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_c48,&local_9b0.super_DeviceInterface,
               (VkDevice)device,2,aStack_9d0.m_align._0_4_,(VkAllocationCallbacks *)0x0);
    DStack_ce0.m_device = local_c38;
    DStack_ce0.m_allocator = pVStack_c30;
    local_ce8.width = local_c48._0_4_;
    local_ce8.height = local_c48._4_4_;
    DStack_ce0.m_deviceIface = pDStack_c40;
    numFences = (long)local_e18 - local_e28._8_8_ >> 2;
    createFences(&local_d18,&local_9b0.super_DeviceInterface,(VkDevice)device,numFences);
    createSemaphores(&local_d30,&local_9b0.super_DeviceInterface,(VkDevice)device,numFences | 1);
    createSemaphores(&local_d48,&local_9b0.super_DeviceInterface,(VkDevice)device,numFences);
    allocateCommandBuffers
              (&local_d60,&local_9b0.super_DeviceInterface,(VkDevice)device,(VkCommandPool)local_ce8
               ,(VkCommandBufferLevel)numFences,numCommandBuffers);
    uVar9 = 0;
    do {
      local_e40 = ((local_d18.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar9 % (ulong)((long)local_d18.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d18.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
      local_e28._0_8_ =
           ((local_d30.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar9 % (ulong)((long)local_d30.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d30.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      local_e4c = 0xffffffff;
      if (numFences <= uVar9) {
        VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[0x16])
                          (&local_9b0,device,1,&local_e40,1,0xffffffffffffffff);
        ::vk::checkResult(VVar4,
                          "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x5f8);
      }
      VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[0x14])
                        (&local_9b0,device,1,&local_e40);
      ::vk::checkResult(VVar4,"vkd.resetFences(device, 1, &imageReadyFence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x5fa);
      puVar10 = &local_e4c;
      VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                        (&local_9b0,device,
                         local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
                         m_internal,0xffffffffffffffff,local_e28._0_8_,local_e40);
      if (VVar4 == VK_SUBOPTIMAL_KHR) {
        local_c48 = (undefined1  [8])local_e48->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_c40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c40,"Got ",4);
        local_cc0.m_getName = ::vk::getResultName;
        local_cc0.m_value = VK_SUBOPTIMAL_KHR;
        tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_cc0,(ostream *)&pDStack_c40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c40," at frame ",10);
        std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_c40);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_c48,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_c40);
        std::ios_base::~ios_base(local_bd0);
      }
      else {
        ::vk::checkResult(VVar4,"acquireResult",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x607);
      }
      if ((ulong)((long)local_e18 - local_e28._8_8_ >> 3) <= (ulong)local_e4c) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                   ,0x60a);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_d68 = ((local_d48.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar9 % (ulong)((long)local_d48.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d48.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      local_d70 = ((local_d60.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar9 % (ulong)((long)local_d60.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d60.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
      local_e2c = 0x400;
      local_c48._0_4_ = 4;
      pDStack_c40 = (DeviceInterface *)0x0;
      local_c38 = (VkDevice)CONCAT44(local_c38._4_4_,1);
      pVStack_c30 = (VkAllocationCallbacks *)local_e28;
      local_c28 = &local_e2c;
      local_c20 = 1;
      local_c18 = &local_d70;
      local_c10 = 1;
      local_ca8 = &local_d68;
      local_cc0.m_getName = (GetNameFunc)CONCAT44(local_cc0.m_getName._4_4_,0x3b9acde9);
      local_cc0.m_value = VK_SUCCESS;
      local_cc0._12_4_ = 0;
      local_cb0 = 1;
      local_ca0 = 1;
      local_c98 = &local_e08;
      local_c90 = &local_e4c;
      local_c88 = 0;
      local_c08 = local_ca8;
      TriangleRenderer::recordFrame(&local_338,local_d70,local_e4c,(deUint32)uVar9);
      VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[2])
                        (&local_9b0,local_4f8,1,local_c48,0);
      ::vk::checkResult(VVar4,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x629);
      VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                        (&local_9b0,local_4f8,&local_cc0);
      ::vk::checkResult(VVar4,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x62a);
      lVar6 = local_d78;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x3c);
    VVar4 = (*local_9b0.super_DeviceInterface._vptr_DeviceInterface[4])(&local_9b0,device);
    ::vk::checkResult(VVar4,"vkd.deviceWaitIdle(device)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x62e);
    local_c38 = local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device;
    pVStack_c30 = local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
                  m_allocator;
    local_c48 = (undefined1  [8])
                local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal;
    pDStack_c40 = local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
                  m_deviceIface;
    local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal = 0;
    local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_da8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()(&DStack_da0,local_da8);
    }
    DStack_da0.m_device = local_c38;
    DStack_da0.m_allocator = pVStack_c30;
    local_da8.m_internal = (deUint64)local_c48;
    DStack_da0.m_deviceIface = pDStack_c40;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector(&local_d60);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&local_d48);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&local_d30);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector(&local_d18);
    if (local_ce8 != (VkExtent2D)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&DStack_ce0,(VkCommandPool)local_ce8);
    }
    TriangleRenderer::~TriangleRenderer(&local_338);
    if ((PFN_vkAllocationFunction)local_e28._8_8_ != (PFN_vkAllocationFunction)0x0) {
      operator_delete((void *)local_e28._8_8_,(long)local_e10 - local_e28._8_8_);
    }
    if (local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                (&local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter,
                 (VkSwapchainKHR)
                 local_e08.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_c48 = (undefined1  [8])&local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"Resizing tests succeeded","")
  ;
  pTVar3 = local_d80;
  local_d80->m_code = QP_TEST_RESULT_PASS;
  (local_d80->m_description)._M_dataplus._M_p = (pointer)&(local_d80->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d80->m_description,local_c48,
             (long)&pDStack_c40->_vptr_DeviceInterface + (long)local_c48);
  if (local_c48 != (undefined1  [8])&local_c38) {
    operator_delete((void *)local_c48,(ulong)(local_c38 + 1));
  }
  if (local_da8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()(&DStack_da0,local_da8);
  }
  operator_delete(pauVar5,0x18);
  ::vk::DeviceDriver::~DeviceDriver(&local_9b0);
  if (local_9c8 != (VkInstance)0x0) {
    (*(code *)pVStack_9c0)(local_9c8,local_9b8);
  }
  local_9c8 = (VkInstance)0x0;
  pVStack_9c0 = (VkAllocationCallbacks *)0x0;
  local_9b8 = (VkAllocationCallbacks *)0x0;
  if (local_dc8.m_internal != 0) {
    (**(code **)(*(long *)aStack_dc0 + 0x68))
              (aStack_dc0.m_align,local_db8,local_dc8.m_internal,pVStack_db0);
  }
  if (local_de8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
      m_data.ptr != (Window *)0x0) {
    (*(local_de8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])();
    local_de8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
    ptr = (Window *)0x0;
  }
  if (local_de8.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
      m_data.ptr != (Display *)0x0) {
    (**(code **)(*(long *)local_de8.display.
                          super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
                          m_data.ptr + 8))();
    local_de8.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
    m_data.ptr = (Display *)0x0;
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_4f0.vki);
  if (local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_4f0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_4f0.supportedExtensions.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f0.supportedExtensions.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4f0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus resizeSwapchainTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize			(256, 256);
	const InstanceHelper			instHelper			(context, wsiType);
	const NativeObjects				native				(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface				(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper			(context, instHelper.vki, *instHelper.instance, *surface);
	const PlatformProperties&		platformProperties	= getPlatformProperties(wsiType);
	const VkSurfaceCapabilitiesKHR	capabilities		= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, devHelper.physicalDevice, *surface);
	const DeviceInterface&			vkd					= devHelper.vkd;
	const VkDevice					device				= *devHelper.device;
	SimpleAllocator					allocator			(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	vector<tcu::UVec2>				sizes				= getSwapchainSizeSequence(capabilities, desiredSize);
	Move<VkSwapchainKHR>			prevSwapchain;

	DE_ASSERT(platformProperties.swapchainExtent != PlatformProperties::SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE);
	DE_UNREF(platformProperties);

	for (deUint32 sizeNdx = 0; sizeNdx < sizes.size(); ++sizeNdx)
	{
		// \todo [2016-05-30 jesse] This test currently waits for idle and
		// recreates way more than necessary when recreating the swapchain. Make
		// it match expected real app behavior better by smoothly switching from
		// old to new swapchain. Once that is done, it will also be possible to
		// test creating a new swapchain while images from the previous one are
		// still acquired.

		VkSwapchainCreateInfoKHR		swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, sizes[sizeNdx], 2);
		swapchainInfo.oldSwapchain = *prevSwapchain;

		Move<VkSwapchainKHR>			swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
		const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);
		const TriangleRenderer			renderer					(vkd,
																	device,
																	allocator,
																	context.getBinaryCollection(),
																	swapchainImages,
																	swapchainInfo.imageFormat,
																	tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));
		const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));
		const size_t					maxQueuedFrames				= swapchainImages.size()*2;

		// We need to keep hold of fences from vkAcquireNextImageKHR to actually
		// limit number of frames we allow to be queued.
		const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

		// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
		// the semaphore in same time as the fence we use to meter rendering.
		const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

		// For rest we simply need maxQueuedFrames as we will wait for image
		// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
		// previous uses must have completed.
		const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
		const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

		try
		{
			const deUint32	numFramesToRender	= 60;

			for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
			{
				const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
				const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
				deUint32			imageNdx			= ~0u;

				if (frameNdx >= maxQueuedFrames)
					VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

				VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

				{
					const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																			  *swapchain,
																			  std::numeric_limits<deUint64>::max(),
																			  imageReadySemaphore,
																			  imageReadyFence,
																			  &imageNdx);

					if (acquireResult == VK_SUBOPTIMAL_KHR)
						context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
					else
						VK_CHECK(acquireResult);
				}

				TCU_CHECK((size_t)imageNdx < swapchainImages.size());

				{
					const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
					const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
					const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
					const VkSubmitInfo			submitInfo					=
					{
						VK_STRUCTURE_TYPE_SUBMIT_INFO,
						DE_NULL,
						1u,
						&imageReadySemaphore,
						&waitDstStage,
						1u,
						&commandBuffer,
						1u,
						&renderingCompleteSemaphore
					};
					const VkPresentInfoKHR		presentInfo					=
					{
						VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
						DE_NULL,
						1u,
						&renderingCompleteSemaphore,
						1u,
						&*swapchain,
						&imageNdx,
						(VkResult*)DE_NULL
					};

					renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
					VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
					VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
				}
			}

			VK_CHECK(vkd.deviceWaitIdle(device));

			prevSwapchain = swapchain;
		}
		catch (...)
		{
			// Make sure device is idle before destroying resources
			vkd.deviceWaitIdle(device);
			throw;
		}
	}

	return tcu::TestStatus::pass("Resizing tests succeeded");
}